

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::QuantizationParams::ByteSizeLong(QuantizationParams *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (this->numberofbits_ == 0) {
    sVar4 = 0;
  }
  else {
    uVar2 = this->numberofbits_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar4 = (size_t)((int)lVar1 * 9 + 0x89U >> 6);
  }
  if (this->_oneof_case_[0] == 0x66) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::LookUpTableQuantizationParams>
                      ((this->QuantizationType_).lookuptablequantization_);
  }
  else {
    if (this->_oneof_case_[0] != 0x65) goto LAB_001f8994;
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::LinearQuantizationParams>
                      ((this->QuantizationType_).linearquantization_);
  }
  sVar4 = sVar4 + sVar3 + 2;
LAB_001f8994:
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar4 = sVar4 + *(long *)((uVar2 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar4;
  return sVar4;
}

Assistant:

size_t QuantizationParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.QuantizationParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // uint64 numberOfBits = 1;
  if (this->_internal_numberofbits() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_numberofbits());
  }

  switch (QuantizationType_case()) {
    // .CoreML.Specification.LinearQuantizationParams linearQuantization = 101;
    case kLinearQuantization: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *QuantizationType_.linearquantization_);
      break;
    }
    // .CoreML.Specification.LookUpTableQuantizationParams lookupTableQuantization = 102;
    case kLookupTableQuantization: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *QuantizationType_.lookuptablequantization_);
      break;
    }
    case QUANTIZATIONTYPE_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}